

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void lua_insert(lua_State *L,int idx)

{
  TValue *pTVar1;
  TValue *pTVar2;
  
  pTVar1 = index2adr(L,idx);
  pTVar2 = L->top;
  if (pTVar1 < pTVar2) {
    do {
      pTVar2->value = pTVar2[-1].value;
      pTVar2->tt = pTVar2[-1].tt;
      pTVar2 = pTVar2 + -1;
    } while (pTVar1 < pTVar2);
    pTVar2 = L->top;
  }
  pTVar1->value = pTVar2->value;
  pTVar1->tt = pTVar2->tt;
  return;
}

Assistant:

static void lua_insert(lua_State*L,int idx){
StkId p;
StkId q;
p=index2adr(L,idx);
api_checkvalidindex(L,p);
for(q=L->top;q>p;q--)setobj(L,q,q-1);
setobj(L,p,L->top);
}